

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O2

void write_line(LineArray *line_array,char *line)

{
  uint uVar1;
  char **ppcVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = line_array->count;
  uVar1 = line_array->cap;
  if (uVar3 < uVar1) {
    ppcVar2 = line_array->lines;
  }
  else {
    uVar4 = 8;
    if (7 < uVar1) {
      uVar4 = (ulong)(uVar1 * 2);
    }
    line_array->cap = (uint32_t)uVar4;
    ppcVar2 = (char **)reallocate(line_array->lines,uVar4 << 3);
    line_array->lines = ppcVar2;
    uVar3 = line_array->count;
  }
  line_array->count = uVar3 + 1;
  ppcVar2[uVar3] = line;
  return;
}

Assistant:

void write_line(LineArray *line_array, char *line) {
    if (line_array->count >= line_array->cap) {
        line_array->cap = GROW_CAP(line_array->cap);
        line_array->lines = GROW_ARR(line_array->lines, char *, line_array->cap);
    }

    line_array->lines[line_array->count++] = line;
}